

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifcvs(bifcxdef *ctx,int argc)

{
  long lVar1;
  size_t sVar2;
  runcxdef *ctx_00;
  long in_RDI;
  char buf [30];
  int len;
  char *p;
  int in_stack_ffffffffffffff9c;
  runcxdef *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char local_48 [44];
  undefined4 local_1c;
  char *local_18;
  
  ctx_00 = (runcxdef *)(ulong)(*(byte *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10) - 1);
  switch(ctx_00) {
  case (runcxdef *)0x0:
    in_stack_ffffffffffffffa8 = local_48;
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    in_stack_ffffffffffffffa0 = *(runcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    sprintf(in_stack_ffffffffffffffa8,"%ld",in_stack_ffffffffffffffa0);
    local_18 = local_48;
    sVar2 = strlen(local_48);
    local_1c = (undefined4)sVar2;
    break;
  default:
    *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "cvtstr";
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
    runsign(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  case (runcxdef *)0x2:
    return;
  case (runcxdef *)0x4:
    local_18 = "nil";
    local_1c = 3;
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if ((*(char *)(lVar1 + -0x10) != '\b') && (**(char **)(*(long *)(in_RDI + 8) + 0x20) != '\x05'))
    {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    break;
  case (runcxdef *)0x7:
    local_18 = "true";
    local_1c = 4;
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if ((*(char *)(lVar1 + -0x10) != '\b') && (**(char **)(*(long *)(in_RDI + 8) + 0x20) != '\x05'))
    {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
  }
  runpstr(ctx_00,in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
          (int)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void bifcvs(bifcxdef *ctx, int argc)
{
    char *p;
    int   len;
    char  buf[30];
    
    bifcntargs(ctx, 1, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_NIL:
        p = "nil";
        len = 3;
        (void)runpoplog(ctx->bifcxrun);
        break;
        
    case DAT_TRUE:
        p = "true";
        len = 4;
        (void)runpoplog(ctx->bifcxrun);
        break;
        
    case DAT_NUMBER:
        sprintf(buf, "%ld", runpopnum(ctx->bifcxrun));
        p = buf;
        len = strlen(buf);
        break;

    case DAT_SSTRING:
        /* leave the string value on the stack unchanged */
        return;

    default:
        /* throw the RUNEXITOBJ error */
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "cvtstr");
    }
    
    runpstr(ctx->bifcxrun, p, len, 0);
}